

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v8::detail::digit_grouping<char16_t>::digit_grouping
          (digit_grouping<char16_t> *this,locale_ref loc,bool localized)

{
  undefined7 in_register_00000011;
  long *local_70;
  long local_68;
  long local_60 [2];
  char local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char16_t local_28;
  
  (this->sep_).grouping._M_dataplus._M_p = (pointer)&(this->sep_).grouping.field_2;
  (this->sep_).grouping._M_string_length = 0;
  (this->sep_).grouping.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,localized) == 0) {
    (this->sep_).thousands_sep = L'\0';
  }
  else {
    fmt::v8::detail::thousands_sep_impl<char>((locale_ref)&local_70);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_70,local_68 + (long)local_70);
    local_28 = (char16_t)local_50;
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_48);
    (this->sep_).thousands_sep = local_28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit digit_grouping(locale_ref loc, bool localized = true) {
    if (localized)
      sep_ = thousands_sep<Char>(loc);
    else
      sep_.thousands_sep = Char();
  }